

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O1

bool __thiscall
cmDepends::Check(cmDepends *this,string *makeFile,string *internalFile,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                *validDeps)

{
  int iVar1;
  bool bVar2;
  ifstream fin;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(internalFile->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    iVar1 = (*this->_vptr_cmDepends[3])(this,local_238,internalFile,validDeps);
    bVar2 = true;
    if ((char)iVar1 != '\0') goto LAB_0035becd;
  }
  Clear(this,makeFile);
  cmsys::SystemTools::RemoveFile(internalFile);
  bVar2 = false;
LAB_0035becd:
  std::ifstream::~ifstream(local_238);
  return bVar2;
}

Assistant:

bool cmDepends::Check(const std::string& makeFile,
                      const std::string& internalFile,
                      std::map<std::string, DependencyVector>& validDeps)
{
  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile.c_str());
  if (!(fin && this->CheckDependencies(fin, internalFile, validDeps))) {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    okay = false;
  }

  return okay;
}